

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

bool __thiscall
tetgenmesh::tetalldihedral
          (tetgenmesh *this,point pa,point pb,point pc,point pd,double *cosdd,double *cosmaxd,
          double *cosmind)

{
  double dVar1;
  double local_f0;
  double local_e8;
  int local_d0;
  int local_cc;
  int j;
  int i;
  int f2;
  int f1;
  double len;
  double cosd;
  double vol;
  double N [4] [3];
  double *cosdd_local;
  point pd_local;
  point pc_local;
  point pb_local;
  point pa_local;
  tetgenmesh *this_local;
  
  i = 0;
  j = 0;
  cosd = 0.0;
  tetallnormal(this,pa,pb,pc,pd,(double (*) [3])&vol,&cosd);
  if (0.0 < cosd) {
    for (local_cc = 0; local_cc < 4; local_cc = local_cc + 1) {
      dVar1 = dot(this,N[(long)local_cc + -1] + 2,N[(long)local_cc + -1] + 2);
      dVar1 = sqrt(dVar1);
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        for (local_d0 = 0; local_d0 < 3; local_d0 = local_d0 + 1) {
          N[(long)local_cc + -1][(long)local_d0 + 2] =
               N[(long)local_cc + -1][(long)local_d0 + 2] / dVar1;
        }
      }
      else {
        cosd = 0.0;
      }
    }
  }
  if (cosd <= 0.0) {
    facenormal(this,pc,pb,pd,&vol,1,(double *)0x0);
    facenormal(this,pa,pc,pd,N[0] + 2,1,(double *)0x0);
    facenormal(this,pb,pa,pd,N[1] + 2,1,(double *)0x0);
    facenormal(this,pa,pb,pc,N[2] + 2,1,(double *)0x0);
    for (local_cc = 0; local_cc < 4; local_cc = local_cc + 1) {
      dVar1 = dot(this,N[(long)local_cc + -1] + 2,N[(long)local_cc + -1] + 2);
      dVar1 = sqrt(dVar1);
      if ((dVar1 == 0.0) && (!NAN(dVar1))) break;
      for (local_d0 = 0; local_d0 < 3; local_d0 = local_d0 + 1) {
        N[(long)local_cc + -1][(long)local_d0 + 2] =
             N[(long)local_cc + -1][(long)local_d0 + 2] / dVar1;
      }
    }
    if (local_cc < 4) {
      if (cosdd != (double *)0x0) {
        for (local_cc = 0; local_cc < 6; local_cc = local_cc + 1) {
          cosdd[local_cc] = -1.0;
        }
      }
      if (cosmaxd != (double *)0x0) {
        *cosmaxd = -1.0;
      }
      if (cosmind != (double *)0x0) {
        *cosmind = -1.0;
      }
      return false;
    }
  }
  for (local_cc = 0; local_cc < 6; local_cc = local_cc + 1) {
    switch(local_cc) {
    case 0:
      i = 0;
      j = 1;
      break;
    case 1:
      i = 1;
      j = 2;
      break;
    case 2:
      i = 2;
      j = 3;
      break;
    case 3:
      i = 0;
      j = 3;
      break;
    case 4:
      i = 2;
      j = 0;
      break;
    case 5:
      i = 1;
      j = 3;
    }
    dVar1 = dot(this,N[(long)i + -1] + 2,N[(long)j + -1] + 2);
    len = -dVar1;
    if (len < -1.0) {
      len = -1.0;
    }
    if (1.0 < len) {
      len = 1.0;
    }
    if (cosdd != (double *)0x0) {
      cosdd[local_cc] = len;
    }
    if ((cosmaxd != (double *)0x0) || (cosmind != (double *)0x0)) {
      if (local_cc == 0) {
        if (cosmaxd != (double *)0x0) {
          *cosmaxd = len;
        }
        if (cosmind != (double *)0x0) {
          *cosmind = len;
        }
      }
      else {
        if (cosmaxd != (double *)0x0) {
          if (*cosmaxd <= len) {
            local_e8 = *cosmaxd;
          }
          else {
            local_e8 = len;
          }
          *cosmaxd = local_e8;
        }
        if (cosmind != (double *)0x0) {
          if (len < *cosmind || len == *cosmind) {
            local_f0 = *cosmind;
          }
          else {
            local_f0 = len;
          }
          *cosmind = local_f0;
        }
      }
    }
  }
  return true;
}

Assistant:

bool tetgenmesh::tetalldihedral(point pa, point pb, point pc, point pd,
                                REAL* cosdd, REAL* cosmaxd, REAL* cosmind)
{
  REAL N[4][3], vol, cosd, len;
  int f1 = 0, f2 = 0, i, j;

  vol = 0; // Check if the tet is valid or not.

  // Get four normals of faces of the tet.
  tetallnormal(pa, pb, pc, pd, N, &vol);

  if (vol > 0) {
    // Normalize the normals.
    for (i = 0; i < 4; i++) {
      len = sqrt(dot(N[i], N[i]));
      if (len != 0.0) {
        for (j = 0; j < 3; j++) N[i][j] /= len;
      } else {
        // There are degeneracies, such as duplicated vertices.
        vol = 0; //assert(0);
      }
    }
  }

  if (vol <= 0) { // if (vol == 0.0) {
    // A degenerated tet or an inverted tet.
    facenormal(pc, pb, pd, N[0], 1, NULL);
    facenormal(pa, pc, pd, N[1], 1, NULL);
    facenormal(pb, pa, pd, N[2], 1, NULL);
    facenormal(pa, pb, pc, N[3], 1, NULL);
    // Normalize the normals.
    for (i = 0; i < 4; i++) {
      len = sqrt(dot(N[i], N[i]));
      if (len != 0.0) {
        for (j = 0; j < 3; j++) N[i][j] /= len;
      } else {
        // There are degeneracies, such as duplicated vertices.
        break; // Not a valid normal.
      }
    }
    if (i < 4) {
      // Do not calculate dihedral angles.
      // Set all angles be 0 degree. There will be no quality optimization for
      //   this tet! Use volume optimization to correct it.
      if (cosdd != NULL) {
        for (i = 0; i < 6; i++) {
          cosdd[i] = -1.0; // 180 degree.
        }
      }
      // This tet has zero volume.
      if (cosmaxd != NULL) {
        *cosmaxd = -1.0; // 180 degree.
      }
      if (cosmind != NULL) {
        *cosmind = -1.0; // 180 degree.
      }
      return false;
    }
  }

  // Calculate the cosine of the dihedral angles of the edges.
  for (i = 0; i < 6; i++) {
    switch (i) {
    case 0: f1 = 0; f2 = 1; break; // [c,d].
    case 1: f1 = 1; f2 = 2; break; // [a,d].
    case 2: f1 = 2; f2 = 3; break; // [a,b].
    case 3: f1 = 0; f2 = 3; break; // [b,c].
    case 4: f1 = 2; f2 = 0; break; // [b,d].
    case 5: f1 = 1; f2 = 3; break; // [a,c].
    }
    cosd = -dot(N[f1], N[f2]);
    if (cosd < -1.0) cosd = -1.0; // Rounding.
    if (cosd >  1.0) cosd =  1.0; // Rounding.
    if (cosdd) cosdd[i] = cosd;
    if (cosmaxd || cosmind) {
      if (i == 0) {
        if (cosmaxd) *cosmaxd = cosd;
        if (cosmind) *cosmind = cosd;
      } else {
        if (cosmaxd) *cosmaxd = cosd < *cosmaxd ? cosd : *cosmaxd;
        if (cosmind) *cosmind = cosd > *cosmind ? cosd : *cosmind;
      }
    }
  }

  return true;
}